

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O3

void ggml_backend_multi_buffer_set_usage
               (ggml_backend_buffer_t buffer,ggml_backend_buffer_usage usage)

{
  long *plVar1;
  ggml_backend_buffer_t buffer_00;
  ulong uVar2;
  ulong uVar3;
  
  if ((buffer->iface).free_buffer == ggml_backend_multi_buffer_free_buffer) {
    plVar1 = (long *)buffer->context;
    uVar2 = plVar1[1];
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        buffer_00 = *(ggml_backend_buffer_t *)(*plVar1 + uVar3 * 8);
        buffer_00->usage = usage;
        if ((buffer_00->iface).free_buffer == ggml_backend_multi_buffer_free_buffer) {
          ggml_backend_multi_buffer_set_usage(buffer_00,usage);
          uVar2 = plVar1[1];
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < uVar2);
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
             ,0x24d,"GGML_ASSERT(%s) failed","ggml_backend_buffer_is_multi_buffer(buffer)");
}

Assistant:

void ggml_backend_multi_buffer_set_usage(ggml_backend_buffer_t buffer, enum ggml_backend_buffer_usage usage) {
    GGML_ASSERT(ggml_backend_buffer_is_multi_buffer(buffer));
    ggml_backend_multi_buffer_context * ctx = (ggml_backend_multi_buffer_context *) buffer->context;
    for (size_t i = 0; i < ctx->n_buffers; i++) {
        ggml_backend_buffer_set_usage(ctx->buffers[i], usage);
    }
}